

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkPrintIo(FILE *pFile,Abc_Ntk_t *pNtk,int fPrintFlops)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pObj_00;
  char *pcVar5;
  char *pcVar6;
  uint local_2c;
  int i;
  Abc_Obj_t *pObj;
  int fPrintFlops_local;
  Abc_Ntk_t *pNtk_local;
  FILE *pFile_local;
  
  uVar1 = Abc_NtkPiNum(pNtk);
  fprintf((FILE *)pFile,"Primary inputs (%d): ",(ulong)uVar1);
  for (local_2c = 0; iVar2 = Abc_NtkPiNum(pNtk), (int)local_2c < iVar2; local_2c = local_2c + 1) {
    pAVar3 = Abc_NtkPi(pNtk,local_2c);
    pcVar4 = Abc_ObjName(pAVar3);
    fprintf((FILE *)pFile," %d=%s",(ulong)local_2c,pcVar4);
  }
  fprintf((FILE *)pFile,"\n");
  uVar1 = Abc_NtkPoNum(pNtk);
  fprintf((FILE *)pFile,"Primary outputs (%d):",(ulong)uVar1);
  for (local_2c = 0; iVar2 = Abc_NtkPoNum(pNtk), (int)local_2c < iVar2; local_2c = local_2c + 1) {
    pAVar3 = Abc_NtkPo(pNtk,local_2c);
    pcVar4 = Abc_ObjName(pAVar3);
    fprintf((FILE *)pFile," %d=%s",(ulong)local_2c,pcVar4);
  }
  fprintf((FILE *)pFile,"\n");
  if (fPrintFlops != 0) {
    uVar1 = Abc_NtkLatchNum(pNtk);
    fprintf((FILE *)pFile,"Latches (%d):  ",(ulong)uVar1);
    for (local_2c = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), (int)local_2c < iVar2;
        local_2c = local_2c + 1) {
      pAVar3 = Abc_NtkBox(pNtk,local_2c);
      iVar2 = Abc_ObjIsLatch(pAVar3);
      if (iVar2 != 0) {
        pcVar4 = Abc_ObjName(pAVar3);
        pObj_00 = Abc_ObjFanout0(pAVar3);
        pcVar5 = Abc_ObjName(pObj_00);
        pAVar3 = Abc_ObjFanin0(pAVar3);
        pcVar6 = Abc_ObjName(pAVar3);
        fprintf((FILE *)pFile," %s(%s=%s)",pcVar4,pcVar5,pcVar6);
      }
    }
    fprintf((FILE *)pFile,"\n");
  }
  return;
}

Assistant:

void Abc_NtkPrintIo( FILE * pFile, Abc_Ntk_t * pNtk, int fPrintFlops )
{
    Abc_Obj_t * pObj;
    int i;

    fprintf( pFile, "Primary inputs (%d): ", Abc_NtkPiNum(pNtk) );
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, " %d=%s", i, Abc_ObjName(pObj) );
//        fprintf( pFile, " %s(%d)", Abc_ObjName(pObj), Abc_ObjFanoutNum(pObj) );
    fprintf( pFile, "\n" );

    fprintf( pFile, "Primary outputs (%d):", Abc_NtkPoNum(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, " %d=%s", i, Abc_ObjName(pObj) );
    fprintf( pFile, "\n" );

    if ( !fPrintFlops )
        return;

    fprintf( pFile, "Latches (%d):  ", Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        fprintf( pFile, " %s(%s=%s)", Abc_ObjName(pObj),
            Abc_ObjName(Abc_ObjFanout0(pObj)), Abc_ObjName(Abc_ObjFanin0(pObj)) );
    fprintf( pFile, "\n" );
}